

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O2

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashSetPolicy<char>,_phmap::Hash<char>,_phmap::EqualTo<char>,_std::allocator<char>_>
::raw_hash_set(raw_hash_set<phmap::priv::FlatHashSetPolicy<char>,_phmap::Hash<char>,_phmap::EqualTo<char>,_std::allocator<char>_>
               *this,size_t bucket_cnt,hasher *hashfn,key_equal *eq,allocator_type *alloc)

{
  long lVar1;
  ulong capacity;
  
  this->ctrl_ = EmptyGroup()::empty_group;
  (this->settings_).
  super_CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<char>,_phmap::EqualTo<char>,_std::allocator<char>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
  .
  super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<char>,_phmap::EqualTo<char>,_std::allocator<char>_>,_0UL,_false>
  .value = 0;
  this->capacity_ = 0;
  this->slots_ = (slot_type *)0x0;
  this->size_ = 0;
  if (bucket_cnt != 0) {
    lVar1 = 0x3f;
    if (bucket_cnt != 0) {
      for (; bucket_cnt >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    capacity = 0xffffffffffffffff >> (~(byte)lVar1 & 0x3f);
    reset_growth_left(this,capacity);
    initialize_slots(this,capacity);
    this->capacity_ = capacity;
  }
  return;
}

Assistant:

explicit raw_hash_set(size_t bucket_cnt, const hasher& hashfn = hasher(),
			                      const key_equal& eq = key_equal(),
			                      const allocator_type& alloc = allocator_type())
				: ctrl_(EmptyGroup()), settings_(0, hashfn, eq, alloc)
			{
				if (bucket_cnt) {
					size_t new_capacity = NormalizeCapacity(bucket_cnt);
					reset_growth_left(new_capacity);
					initialize_slots(new_capacity);
					capacity_ = new_capacity;
				}
			}